

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall
asl::Array<char>::clone
          (Array<char> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int m;
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)__fn;
  m = *(int *)(lVar1 + -0x10);
  alloc(this,m);
  if (0 < (long)m) {
    lVar2 = 0;
    do {
      this->_a[lVar2] = *(char *)(lVar1 + lVar2);
      lVar2 = lVar2 + 1;
    } while (m != lVar2);
  }
  return (int)this;
}

Assistant:

Array clone() const
	{
		Array b(_a, length());
		return b;
	}